

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

int PAL_fsetpos(PAL_FILE *f,PAL_fpos_t *pos)

{
  fprintf(_stderr,"] %s %s:%d","PAL_fsetpos",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
          ,0x32c);
  fprintf(_stderr,(char *)0x0);
  return -1;
}

Assistant:

int
__cdecl
PAL_fsetpos (
    PAL_FILE         *f,
    const PAL_fpos_t *pos
)
{
#ifdef __LINUX__
    // TODO: implement for Linux if required
    ASSERT(FALSE);
    return  -1;
#else
    int    nRetVal = -1;
    fpos_t native_pos;

    PERF_ENTRY(fsetpos);
    ENTRY("fsetpos( f=%p, pos=%p )\n", f, pos);

    _ASSERTE(f != NULL);
    _ASSERTE(pos != NULL);

    if (pos) {
        native_pos = *pos;
        nRetVal = fsetpos (f->bsdFilePtr, &native_pos);
    }
    else {
        ERROR ("Error: NULL pos pointer\n");
        errno = EINVAL;
    }

    LOGEXIT( "fsetpos returning error code %d\n", nRetVal);
    PERF_EXIT(fsetpos);
    return nRetVal;
#endif // __LINUX__
}